

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBaf.c
# Opt level: O0

Abc_Ntk_t * Io_ReadBaf(char *pFileName,int fCheck)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int nItemsTotal;
  FILE *__stream;
  uint *__ptr;
  char *pcVar6;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pObj_00;
  ProgressBar *p_00;
  uint *puVar9;
  uint *puVar10;
  int RetValue;
  uint *pBufferNode;
  char *pCur;
  char *pName;
  char *pContents;
  uint local_70;
  int i;
  int Num;
  int nFileSize;
  int nAnds;
  int nLatches;
  int nOutputs;
  int nInputs;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  FILE *pFile;
  ProgressBar *pProgress;
  int fCheck_local;
  char *pFileName_local;
  
  iVar2 = Extra_FileSize(pFileName);
  __stream = fopen(pFileName,"rb");
  __ptr = (uint *)malloc((long)iVar2);
  fread(__ptr,(long)iVar2,1,__stream);
  fclose(__stream);
  pBufferNode = __ptr;
  while (puVar9 = pBufferNode, (char)*pBufferNode == '#') {
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\n');
  }
  do {
    puVar10 = (uint *)((long)pBufferNode + 1);
    uVar1 = *pBufferNode;
    pBufferNode = puVar10;
  } while ((char)uVar1 != '\0');
  iVar3 = atoi((char *)puVar10);
  do {
    puVar10 = (uint *)((long)pBufferNode + 1);
    uVar1 = *pBufferNode;
    pBufferNode = puVar10;
  } while ((char)uVar1 != '\0');
  iVar4 = atoi((char *)puVar10);
  do {
    puVar10 = (uint *)((long)pBufferNode + 1);
    uVar1 = *pBufferNode;
    pBufferNode = puVar10;
  } while ((char)uVar1 != '\0');
  iVar5 = atoi((char *)puVar10);
  do {
    puVar10 = (uint *)((long)pBufferNode + 1);
    uVar1 = *pBufferNode;
    pBufferNode = puVar10;
  } while ((char)uVar1 != '\0');
  nItemsTotal = atoi((char *)puVar10);
  do {
    puVar10 = (uint *)((long)pBufferNode + 1);
    uVar1 = *pBufferNode;
    pBufferNode = puVar10;
  } while ((char)uVar1 != '\0');
  pFileName_local = (char *)Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar6 = Extra_UtilStrsav((char *)puVar9);
  ((Abc_Ntk_t *)pFileName_local)->pName = pcVar6;
  pcVar6 = Extra_UtilStrsav(pFileName);
  ((Abc_Ntk_t *)pFileName_local)->pSpec = pcVar6;
  p = Vec_PtrAlloc(iVar3 + 1 + iVar5 + nItemsTotal);
  pAVar7 = Abc_AigConst1((Abc_Ntk_t *)pFileName_local);
  Vec_PtrPush(p,pAVar7);
  for (pContents._4_4_ = 0; pContents._4_4_ < iVar3; pContents._4_4_ = pContents._4_4_ + 1) {
    pAVar7 = Abc_NtkCreatePi((Abc_Ntk_t *)pFileName_local);
    Abc_ObjAssignName(pAVar7,(char *)pBufferNode,(char *)0x0);
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\0');
    Vec_PtrPush(p,pAVar7);
  }
  for (pContents._4_4_ = 0; pContents._4_4_ < iVar4; pContents._4_4_ = pContents._4_4_ + 1) {
    pAVar7 = Abc_NtkCreatePo((Abc_Ntk_t *)pFileName_local);
    Abc_ObjAssignName(pAVar7,(char *)pBufferNode,(char *)0x0);
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\0');
  }
  for (pContents._4_4_ = 0; pContents._4_4_ < iVar5; pContents._4_4_ = pContents._4_4_ + 1) {
    pAVar7 = Abc_NtkCreateLatch((Abc_Ntk_t *)pFileName_local);
    Abc_ObjAssignName(pAVar7,(char *)pBufferNode,(char *)0x0);
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\0');
    pAVar8 = Abc_NtkCreateBi((Abc_Ntk_t *)pFileName_local);
    Abc_ObjAssignName(pAVar8,(char *)puVar9,(char *)0x0);
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\0');
    pObj_00 = Abc_NtkCreateBo((Abc_Ntk_t *)pFileName_local);
    Abc_ObjAssignName(pObj_00,(char *)puVar9,(char *)0x0);
    do {
      puVar9 = (uint *)((long)pBufferNode + 1);
      uVar1 = *pBufferNode;
      pBufferNode = puVar9;
    } while ((char)uVar1 != '\0');
    Vec_PtrPush(p,pObj_00);
    Abc_ObjAddFanin(pAVar7,pAVar8);
    Abc_ObjAddFanin(pObj_00,pAVar7);
  }
  puVar9 = (uint *)((long)__ptr + (long)iVar2 + (long)(nItemsTotal * 2 + iVar4 + iVar5) * -4);
  if (puVar9 == pBufferNode) {
    p_00 = Extra_ProgressBarStart(_stdout,nItemsTotal);
    for (pContents._4_4_ = 0; pContents._4_4_ < nItemsTotal; pContents._4_4_ = pContents._4_4_ + 1)
    {
      Extra_ProgressBarUpdate(p_00,pContents._4_4_,(char *)0x0);
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,puVar9[pContents._4_4_ << 1] >> 1);
      pAVar7 = Abc_ObjNotCond(pAVar7,puVar9[pContents._4_4_ << 1] & 1);
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p,puVar9[pContents._4_4_ * 2 + 1] >> 1);
      pAVar8 = Abc_ObjNotCond(pAVar8,puVar9[pContents._4_4_ * 2 + 1] & 1);
      pAVar7 = Abc_AigAnd((Abc_Aig_t *)((Abc_Ntk_t *)pFileName_local)->pManFunc,pAVar7,pAVar8);
      Vec_PtrPush(p,pAVar7);
    }
    Extra_ProgressBarStop(p_00);
    for (pContents._4_4_ = 0; iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)pFileName_local),
        pContents._4_4_ < iVar2; pContents._4_4_ = pContents._4_4_ + 1) {
      pAVar7 = Abc_NtkCo((Abc_Ntk_t *)pFileName_local,pContents._4_4_);
      local_70 = puVar9[nItemsTotal * 2 + pContents._4_4_];
      iVar2 = Abc_ObjFanoutNum(pAVar7);
      if (0 < iVar2) {
        pAVar8 = Abc_ObjFanout0(pAVar7);
        iVar2 = Abc_ObjIsLatch(pAVar8);
        if (iVar2 != 0) {
          pAVar8 = Abc_ObjFanout0(pAVar7);
          Abc_ObjSetData(pAVar8,(void *)(long)(int)(local_70 & 3));
          local_70 = (int)local_70 >> 2;
        }
      }
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p,(int)local_70 >> 1);
      pAVar8 = Abc_ObjNotCond(pAVar8,local_70 & 1);
      Abc_ObjAddFanin(pAVar7,pAVar8);
    }
    if (__ptr != (uint *)0x0) {
      free(__ptr);
    }
    Vec_PtrFree(p);
    if ((fCheck != 0) && (iVar2 = Abc_NtkCheckRead((Abc_Ntk_t *)pFileName_local), iVar2 == 0)) {
      printf("Io_ReadBaf: The network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
      pFileName_local = (char *)0x0;
    }
  }
  else {
    if (__ptr != (uint *)0x0) {
      free(__ptr);
    }
    Vec_PtrFree(p);
    Abc_NtkDelete((Abc_Ntk_t *)pFileName_local);
    printf("Warning: Internal reader error.\n");
    pFileName_local = (char *)0x0;
  }
  return (Abc_Ntk_t *)pFileName_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Io_ReadBaf( char * pFileName, int fCheck )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    Abc_Ntk_t * pNtkNew;
    int nInputs, nOutputs, nLatches, nAnds, nFileSize, Num, i;
    char * pContents, * pName, * pCur;
    unsigned * pBufferNode;
    int RetValue;

    // read the file into the buffer
    nFileSize = Extra_FileSize( pFileName );
    pFile = fopen( pFileName, "rb" );
    pContents = ABC_ALLOC( char, nFileSize );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    fclose( pFile );

    // skip the comments (comment lines begin with '#' and end with '\n')
    for ( pCur = pContents; *pCur == '#'; )
        while ( *pCur++ != '\n' );

    // read the name
    pName = pCur;             while ( *pCur++ );
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur++ );
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur++ );
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur++ );
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur++ );

    // allocate the empty AIG
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pFileName );

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Abc_AigConst1(pNtkNew) );

    // create the PIs
    for ( i = 0; i < nInputs; i++ )
    {
        pObj = Abc_NtkCreatePi(pNtkNew);    
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ );
        Vec_PtrPush( vNodes, pObj );
    }
    // create the POs
    for ( i = 0; i < nOutputs; i++ )
    {
        pObj = Abc_NtkCreatePo(pNtkNew);   
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 
    }
    // create the latches
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_ObjAssignName( pObj, pCur, NULL );  while ( *pCur++ ); 

        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_ObjAssignName( pNode0, pCur, NULL );  while ( *pCur++ ); 

        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_ObjAssignName( pNode1, pCur, NULL );  while ( *pCur++ ); 
        Vec_PtrPush( vNodes, pNode1 );

        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
    }

    // get the pointer to the beginning of the node array
    pBufferNode = (unsigned *)(pContents + (nFileSize - (2 * nAnds + nOutputs + nLatches) * sizeof(int)) );
    // make sure we are at the place where the nodes begin
    if ( pBufferNode != (unsigned *)pCur )
    {
        ABC_FREE( pContents );
        Vec_PtrFree( vNodes );
        Abc_NtkDelete( pNtkNew );
        printf( "Warning: Internal reader error.\n" );
        return NULL;
    }

    // create the AND gates
    pProgress = Extra_ProgressBarStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+0] >> 1), pBufferNode[2*i+0] & 1 );
        pNode1 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, pBufferNode[2*i+1] >> 1), pBufferNode[2*i+1] & 1 );
        Vec_PtrPush( vNodes, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pNode0, pNode1) );
    }
    Extra_ProgressBarStop( pProgress );

    // read the POs
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        Num = pBufferNode[2*nAnds+i];
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
        {
            Abc_ObjSetData( Abc_ObjFanout0(pObj), (void *)(ABC_PTRINT_T)(Num & 3) );
            Num >>= 2;
        }
        pNode0 = Abc_ObjNotCond( (Abc_Obj_t *)Vec_PtrEntry(vNodes, Num >> 1), Num & 1 );
        Abc_ObjAddFanin( pObj, pNode0 );
    }
    ABC_FREE( pContents );
    Vec_PtrFree( vNodes );

    // remove the extra nodes
//    Abc_AigCleanup( (Abc_Aig_t *)pNtkNew->pManFunc );

    // check the result
    if ( fCheck && !Abc_NtkCheckRead( pNtkNew ) )
    {
        printf( "Io_ReadBaf: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;

}